

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

string * __thiscall
t_netstd_generator::get_deep_copy_method_call_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this,t_type *ttype,
          bool *needs_typecast)

{
  long lVar1;
  int iVar2;
  t_type *ptVar3;
  long *plVar4;
  size_type *psVar5;
  char *pcVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ptVar3 = resolve_typedef(ttype);
  *needs_typecast = false;
  iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[5])(ptVar3);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[10])(ptVar3);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xd])(ptVar3);
      *needs_typecast = (bool)((byte)iVar2 ^ 1);
      std::operator+(&local_38,".",&DEEP_COPY_METHOD_NAME_abi_cxx11_);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        lVar1 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_38._M_dataplus._M_p);
      return __return_storage_ptr__;
    }
LAB_002b9bdf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    if (*(int *)&ptVar3[1].super_t_doc._vptr_t_doc != 1) goto LAB_002b9bdf;
    iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[7])(ptVar3);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((char)iVar2 != '\0') {
      pcVar7 = ".ToArray()";
      pcVar6 = "";
      goto LAB_002b9bf3;
    }
  }
  pcVar6 = "";
  pcVar7 = "";
LAB_002b9bf3:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::get_deep_copy_method_call(t_type* ttype, bool& needs_typecast)
{
    ttype = resolve_typedef(ttype);

    needs_typecast = false;
    if (ttype->is_base_type())
    {
        t_base_type::t_base tbase = static_cast<t_base_type*>(ttype)->get_base();
        switch (tbase)
        {
        case t_base_type::TYPE_STRING:
            if (ttype->is_binary())
            {
                return ".ToArray()";
            } else {
                return "";  // simple assignment will do, strings are immutable in C#
            }
            break;
        default:
            return "";  // simple assignment will do
        }
    }
    else if (ttype->is_enum())
    {
        return "";  // simple assignment will do
    }
    else
    {
        needs_typecast = (! ttype->is_container());
        return "." + DEEP_COPY_METHOD_NAME + "()";
    }
}